

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit.h
# Opt level: O1

bool __thiscall
bandit::run_policy::bandit::should_run(bandit *this,string *it_name,stack_t *contexts)

{
  pointer pfVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer pfVar7;
  bool bVar8;
  filter_chain_element filter;
  string local_60;
  char local_40;
  string *local_38;
  
  if ((this->dry_run_ != false) ||
     (((local_38 = it_name, this->break_on_failure_ == true &&
       (iVar5 = (*(this->super_interface)._vptr_interface[4])(this), (char)iVar5 != '\0')) ||
      (bVar3 = has_context_with_hard_skip(this,contexts), bVar3)))) {
    bVar3 = false;
  }
  else {
    pfVar7 = (this->filter_chain_).
             super__Vector_base<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar1 = (this->filter_chain_).
             super__Vector_base<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = pfVar7 == pfVar1;
    if (!bVar3) {
      do {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        pcVar2 = (pfVar7->pattern)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar2,pcVar2 + (pfVar7->pattern)._M_string_length);
        local_40 = pfVar7->skip;
        bVar4 = context_matches_pattern(this,contexts,&local_60);
        bVar8 = true;
        if (!bVar4) {
          lVar6 = std::__cxx11::string::find((char *)local_38,(ulong)local_60._M_dataplus._M_p,0);
          bVar8 = lVar6 != -1;
        }
        if (bVar8 == (bool)local_40) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p == &local_60.field_2) {
            return bVar3;
          }
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          return bVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pfVar7 = pfVar7 + 1;
        bVar3 = pfVar7 == pfVar1;
      } while (!bVar3);
    }
  }
  return bVar3;
}

Assistant:

bool should_run(const std::string& it_name, const context::stack_t& contexts) const override {
        if (dry_run_) {
          return false;
        }

        if (break_on_failure_ && has_encountered_failure()) {
          return false;
        }

        // Never run if a context has been marked as skip
        // using 'describe_skip'
        if (has_context_with_hard_skip(contexts)) {
          return false;
        }

        // Now go through the filter chain
        for (auto filter : filter_chain_) {
          bool match = context_matches_pattern(contexts, filter.pattern) || matches_pattern(it_name, filter.pattern);
          bool skip_applies = filter.skip && match;
          bool only_applies = !filter.skip && !match;
          if (skip_applies || only_applies) {
            return false;
          }
        }

        return true;
      }